

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O1

void monkilled(monst *mdef,char *fltxt,int how)

{
  permonst *ppVar1;
  byte bVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  
  pcVar6 = m_monnam(mdef);
  iVar4 = strcmp(pcVar6,"Kenny");
  if (mdef->wormno == '\0') {
    if (fltxt != (char *)0x0) {
      bVar2 = viz_array[mdef->my][mdef->mx] & 2;
      goto joined_r0x001e9962;
    }
  }
  else {
    bVar2 = worm_known(level,mdef);
    if (fltxt != (char *)0x0) {
joined_r0x001e9962:
      if (bVar2 != 0) {
        pcVar6 = Monnam(mdef);
        ppVar1 = mdef->data;
        pcVar8 = "destroyed";
        if ((((ppVar1->mlet != '7') && (ppVar1->mlet != '\x16')) && ((ppVar1->mflags2 & 2) == 0)) &&
           (pcVar8 = "killed", ppVar1 == mons + 0x33)) {
          pcVar8 = "destroyed";
        }
        pcVar7 = " by the ";
        if (*fltxt == '\0') {
          pcVar7 = "";
        }
        pline("%s is %s%s%s!",pcVar6,pcVar8,pcVar7,fltxt);
        bVar9 = true;
        goto LAB_001e99e7;
      }
    }
  }
  bVar9 = mdef->mtame == '\0';
LAB_001e99e7:
  if (((how == -0xf2) || (how == 0x1a)) || (how == 5)) {
    mondead_helper(mdef,how);
  }
  else {
    mondied(mdef);
  }
  if (mdef->data == mons + 0x143) {
    cthulhu_dies(mdef);
  }
  if ((!bVar9) && (mdef->mhp < 1)) {
    if ((iVar4 != 0) &&
       (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
        (((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')) ||
         (uVar5 = mt_random(), (uVar5 & 3) != 0)))))) {
      pcVar6 = "sad";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar6 = "plaid";
        }
        else {
          bVar3 = dmgtype(youmonst.data,0x24);
          pcVar6 = "sad";
          if (bVar3 == '\0') {
            pcVar6 = "plaid";
          }
        }
      }
      pline("You have a %s feeling for a moment, then it passes.",pcVar6);
      return;
    }
    verbalize("Oh my god, they killed Kenny!");
    verbalize("You bastards!");
    return;
  }
  return;
}

Assistant:

void monkilled(struct monst *mdef, const char *fltxt, int how)
{
	boolean be_sad = FALSE;		/* true if unseen pet is killed */
	boolean kenny = !strcmp(m_monnam(mdef), "Kenny");

	if ((mdef->wormno ? worm_known(level, mdef) : cansee(mdef->mx, mdef->my))
		&& fltxt)
	    pline("%s is %s%s%s!", Monnam(mdef),
			nonliving(mdef->data) ? "destroyed" : "killed",
		    *fltxt ? " by the " : "",
		    fltxt
		 );
	else
	    be_sad = (mdef->mtame != 0);

	/* no corpses if digested or disintegrated */
	if (how == AD_DGST || how == -AD_RBRE || how == AD_DISN)
	    mondead_helper(mdef, how);
	else
	    mondied(mdef);

	if (mdef->data == &mons[PM_CTHULHU])
	    cthulhu_dies(mdef);

	if (be_sad && mdef->mhp <= 0) {
	    if (kenny || (Hallucination && !rn2(4))) {
		verbalize("Oh my god, they killed Kenny!");
		verbalize("You bastards!");
	    } else {
		pline("You have a %s feeling for a moment, then it passes.",
			(Hallucination ? "plaid" : "sad"));
	    }
	}
}